

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

char * CVodeGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  pcVar1 = (char *)malloc(0x18);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1,"CV_SUCCESS",0xb);
    break;
  case 1:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'T';
    uVar8._0_1_ = 'S';
    uVar8._1_1_ = 'T';
    uVar8._2_1_ = 'O';
    uVar8._3_1_ = 'P';
    uVar10._0_1_ = '_';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'E';
    uVar10._3_1_ = 'T';
    uVar12._0_1_ = 'U';
    uVar12._1_1_ = 'R';
    uVar12._2_1_ = 'N';
    uVar12._3_1_ = '\0';
LAB_001138e4:
    *(undefined4 *)pcVar1 = uVar5;
    *(undefined4 *)(pcVar1 + 4) = uVar8;
    *(undefined4 *)(pcVar1 + 8) = uVar10;
    *(undefined4 *)(pcVar1 + 0xc) = uVar12;
    break;
  case 2:
    builtin_strncpy(pcVar1 + 7,"_RETURN",8);
    uVar2 = 0x5f544f4f525f5643;
LAB_001138d8:
    *(undefined8 *)pcVar1 = uVar2;
    break;
  case -0x1f:
    builtin_strncpy(pcVar1,"CV_REPTD_PROJFUNC_ERR",0x16);
    break;
  case -0x1e:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'P';
    uVar6._0_1_ = 'R';
    uVar6._1_1_ = 'O';
    uVar6._2_1_ = 'J';
    uVar6._3_1_ = 'F';
    uVar9._0_1_ = 'U';
    uVar9._1_1_ = 'N';
    uVar9._2_1_ = 'C';
    uVar9._3_1_ = '_';
    uVar11._0_1_ = 'F';
    uVar11._1_1_ = 'A';
    uVar11._2_1_ = 'I';
    uVar11._3_1_ = 'L';
    goto LAB_001137c3;
  case -0x1d:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'P';
    uVar6._0_1_ = 'R';
    uVar6._1_1_ = 'O';
    uVar6._2_1_ = 'J';
    uVar6._3_1_ = '_';
    uVar9._0_1_ = 'M';
    uVar9._1_1_ = 'E';
    uVar9._2_1_ = 'M';
    uVar9._3_1_ = '_';
    uVar11._0_1_ = 'N';
    uVar11._1_1_ = 'U';
    uVar11._2_1_ = 'L';
    uVar11._3_1_ = 'L';
    goto LAB_001137c3;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -0x1b:
    builtin_strncpy(pcVar1 + 5,"O_CLOSE",8);
    uVar2 = 0x435f4f4f545f5643;
    goto LAB_001138d8;
  case -0x1a:
    builtin_strncpy(pcVar1,"CV_BAD_DKY",0xb);
    break;
  case -0x19:
    uVar2 = 0x545f4441425f5643;
    goto LAB_001137d9;
  case -0x18:
    uVar2 = 0x4b5f4441425f5643;
LAB_001137d9:
    *(undefined8 *)pcVar1 = uVar2;
    pcVar1[8] = '\0';
    break;
  case -0x17:
    builtin_strncpy(pcVar1 + 5,"_MALLOC",8);
    uVar2 = 0x414d5f4f4e5f5643;
    goto LAB_001138d8;
  case -0x16:
    builtin_strncpy(pcVar1 + 5,"L_INPUT",8);
    uVar2 = 0x495f4c4c495f5643;
    goto LAB_001138d8;
  case -0x15:
    builtin_strncpy(pcVar1,"CV_MEM_NULL",0xc);
    break;
  case -0x14:
    uVar2 = 0x465f4d454d5f5643;
    goto LAB_001137a1;
  case -0x10:
    uVar2 = 0x465f534c4e5f5643;
LAB_001137a1:
    *(undefined8 *)pcVar1 = uVar2;
    pcVar1[8] = 'A';
    pcVar1[9] = 'I';
    pcVar1[10] = 'L';
    pcVar1[0xb] = '\0';
    break;
  case -0xe:
    builtin_strncpy(pcVar1,"CV_NLS_SETUPT_FAIL",0x13);
    break;
  case -0xd:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'N';
    uVar6._0_1_ = 'L';
    uVar6._1_1_ = 'S';
    uVar6._2_1_ = '_';
    uVar6._3_1_ = 'I';
    uVar9._0_1_ = 'N';
    uVar9._1_1_ = 'I';
    uVar9._2_1_ = 'T';
    uVar9._3_1_ = '_';
    uVar11._0_1_ = 'F';
    uVar11._1_1_ = 'A';
    uVar11._2_1_ = 'I';
    uVar11._3_1_ = 'L';
    goto LAB_001137c3;
  case -0xc:
    builtin_strncpy(pcVar1 + 7,"NC_FAIL",8);
    uVar2 = 0x4e554654525f5643;
    goto LAB_001138d8;
  case -0xb:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'V';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'U';
    uVar7._0_1_ = 'N';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'E';
    uVar7._3_1_ = 'C';
    goto LAB_001138ad;
  case -10:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'V';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'R';
    uVar7._0_1_ = 'E';
    uVar7._1_1_ = 'P';
    uVar7._2_1_ = 'T';
    uVar7._3_1_ = 'D';
    goto LAB_001138ad;
  case -9:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'V';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'F';
    uVar7._0_1_ = 'I';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'S';
    uVar7._3_1_ = 'T';
LAB_001138ad:
    *(undefined4 *)pcVar1 = uVar4;
    *(undefined4 *)(pcVar1 + 4) = uVar7;
    pcVar1[8] = '_';
    pcVar1[9] = 'R';
    pcVar1[10] = 'H';
    pcVar1[0xb] = 'S';
    pcVar1[0xc] = 'F';
    pcVar1[0xd] = 'U';
    pcVar1[0xe] = 'N';
    pcVar1[0xf] = 'C';
    pcVar1[0xd] = 'U';
    pcVar1[0xe] = 'N';
    pcVar1[0xf] = 'C';
    pcVar1[0x10] = '_';
    pcVar1[0x11] = 'E';
    pcVar1[0x12] = 'R';
    pcVar1[0x13] = 'R';
    pcVar1[0x14] = '\0';
    break;
  case -8:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'R';
    uVar8._0_1_ = 'H';
    uVar8._1_1_ = 'S';
    uVar8._2_1_ = 'F';
    uVar8._3_1_ = 'U';
    uVar10._0_1_ = 'N';
    uVar10._1_1_ = 'C';
    uVar10._2_1_ = '_';
    uVar10._3_1_ = 'F';
    uVar12._0_1_ = 'A';
    uVar12._1_1_ = 'I';
    uVar12._2_1_ = 'L';
    uVar12._3_1_ = '\0';
    goto LAB_001138e4;
  case -7:
    builtin_strncpy(pcVar1 + 7,"VE_FAIL",8);
    uVar2 = 0x564c4f534c5f5643;
    goto LAB_001138d8;
  case -6:
    builtin_strncpy(pcVar1 + 7,"UP_FAIL",8);
    uVar2 = 0x555445534c5f5643;
    goto LAB_001138d8;
  case -5:
    builtin_strncpy(pcVar1 + 6,"IT_FAIL",8);
    uVar2 = 0x54494e494c5f5643;
    goto LAB_001138d8;
  case -4:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'C';
    uVar8._0_1_ = 'O';
    uVar8._1_1_ = 'N';
    uVar8._2_1_ = 'V';
    uVar8._3_1_ = '_';
    uVar10._0_1_ = 'F';
    uVar10._1_1_ = 'A';
    uVar10._2_1_ = 'I';
    uVar10._3_1_ = 'L';
    uVar12._0_1_ = 'U';
    uVar12._1_1_ = 'R';
    uVar12._2_1_ = 'E';
    uVar12._3_1_ = '\0';
    goto LAB_001138e4;
  case -3:
    builtin_strncpy(pcVar1 + 7,"FAILURE",8);
    uVar2 = 0x465f5252455f5643;
    goto LAB_001138d8;
  case -2:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'T';
    uVar8._0_1_ = 'O';
    uVar8._1_1_ = 'O';
    uVar8._2_1_ = '_';
    uVar8._3_1_ = 'M';
    uVar10._0_1_ = 'U';
    uVar10._1_1_ = 'C';
    uVar10._2_1_ = 'H';
    uVar10._3_1_ = '_';
    uVar12._0_1_ = 'A';
    uVar12._1_1_ = 'C';
    uVar12._2_1_ = 'C';
    uVar12._3_1_ = '\0';
    goto LAB_001138e4;
  case -1:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'T';
    uVar6._0_1_ = 'O';
    uVar6._1_1_ = 'O';
    uVar6._2_1_ = '_';
    uVar6._3_1_ = 'M';
    uVar9._0_1_ = 'U';
    uVar9._1_1_ = 'C';
    uVar9._2_1_ = 'H';
    uVar9._3_1_ = '_';
    uVar11._0_1_ = 'W';
    uVar11._1_1_ = 'O';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'K';
LAB_001137c3:
    *(undefined4 *)pcVar1 = uVar3;
    *(undefined4 *)(pcVar1 + 4) = uVar6;
    *(undefined4 *)(pcVar1 + 8) = uVar9;
    *(undefined4 *)(pcVar1 + 0xc) = uVar11;
    pcVar1[0x10] = '\0';
  }
  return pcVar1;
}

Assistant:

char* CVodeGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(24 * sizeof(char));

  switch (flag)
  {
  case CV_SUCCESS: sprintf(name, "CV_SUCCESS"); break;
  case CV_TSTOP_RETURN: sprintf(name, "CV_TSTOP_RETURN"); break;
  case CV_ROOT_RETURN: sprintf(name, "CV_ROOT_RETURN"); break;
  case CV_TOO_MUCH_WORK: sprintf(name, "CV_TOO_MUCH_WORK"); break;
  case CV_TOO_MUCH_ACC: sprintf(name, "CV_TOO_MUCH_ACC"); break;
  case CV_ERR_FAILURE: sprintf(name, "CV_ERR_FAILURE"); break;
  case CV_CONV_FAILURE: sprintf(name, "CV_CONV_FAILURE"); break;
  case CV_LINIT_FAIL: sprintf(name, "CV_LINIT_FAIL"); break;
  case CV_LSETUP_FAIL: sprintf(name, "CV_LSETUP_FAIL"); break;
  case CV_LSOLVE_FAIL: sprintf(name, "CV_LSOLVE_FAIL"); break;
  case CV_RHSFUNC_FAIL: sprintf(name, "CV_RHSFUNC_FAIL"); break;
  case CV_FIRST_RHSFUNC_ERR: sprintf(name, "CV_FIRST_RHSFUNC_ERR"); break;
  case CV_REPTD_RHSFUNC_ERR: sprintf(name, "CV_REPTD_RHSFUNC_ERR"); break;
  case CV_UNREC_RHSFUNC_ERR: sprintf(name, "CV_UNREC_RHSFUNC_ERR"); break;
  case CV_RTFUNC_FAIL: sprintf(name, "CV_RTFUNC_FAIL"); break;
  case CV_MEM_FAIL: sprintf(name, "CV_MEM_FAIL"); break;
  case CV_MEM_NULL: sprintf(name, "CV_MEM_NULL"); break;
  case CV_ILL_INPUT: sprintf(name, "CV_ILL_INPUT"); break;
  case CV_NO_MALLOC: sprintf(name, "CV_NO_MALLOC"); break;
  case CV_BAD_K: sprintf(name, "CV_BAD_K"); break;
  case CV_BAD_T: sprintf(name, "CV_BAD_T"); break;
  case CV_BAD_DKY: sprintf(name, "CV_BAD_DKY"); break;
  case CV_TOO_CLOSE: sprintf(name, "CV_TOO_CLOSE"); break;
  case CV_NLS_INIT_FAIL: sprintf(name, "CV_NLS_INIT_FAIL"); break;
  case CV_NLS_SETUP_FAIL: sprintf(name, "CV_NLS_SETUPT_FAIL"); break;
  case CV_NLS_FAIL: sprintf(name, "CV_NLS_FAIL"); break;
  case CV_PROJ_MEM_NULL: sprintf(name, "CV_PROJ_MEM_NULL"); break;
  case CV_PROJFUNC_FAIL: sprintf(name, "CV_PROJFUNC_FAIL"); break;
  case CV_REPTD_PROJFUNC_ERR: sprintf(name, "CV_REPTD_PROJFUNC_ERR"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}